

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O0

void __thiscall re2::NFA::Decref(NFA *this,Thread *t)

{
  Thread *t_local;
  NFA *this_local;
  
  if ((t != (Thread *)0x0) && ((t->field_0).ref = (t->field_0).ref + -1, (t->field_0).ref < 1)) {
    if ((t->field_0).ref != 0) {
      __assert_fail("(t->ref) == (0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",
                    0xb7,"void re2::NFA::Decref(Thread *)");
    }
    t->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
    this->free_threads_ = t;
  }
  return;
}

Assistant:

void NFA::Decref(Thread* t) {
  if (t == NULL)
    return;
  t->ref--;
  if (t->ref > 0)
    return;
  DCHECK_EQ(t->ref, 0);
  t->next = free_threads_;
  free_threads_ = t;
}